

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O2

string * __thiscall
Catch::StringMaker<float,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<float,void> *this,float value)

{
  string local_30;
  
  fpToString<float>(&local_30,value,precision);
  std::operator+(__return_storage_ptr__,&local_30,'f');
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<float>::convert(float value) {
    return fpToString(value, precision) + 'f';
}